

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::CodeGeneratorRequest::Clear(CodeGeneratorRequest *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *pLVar2;
  LogFinisher local_ca;
  byte local_c9;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  CodeGeneratorRequest *local_40;
  CodeGeneratorRequest *this_local;
  HasBits<1UL> *local_30;
  HasBits<1UL> *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->file_to_generate_);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::Clear(&this->proto_file_);
  local_30 = &this->_has_bits_;
  this_local._4_4_ = 0;
  if ((local_30->has_bits_[0] & 3) != 0) {
    bVar1 = has_parameter(this);
    if (bVar1) {
      default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = internal::ArenaStringPtr::IsDefault(&this->parameter_,default_value);
      local_79 = 0;
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x332);
        local_79 = 1;
        pLVar2 = internal::LogMessage::operator<<
                           (&local_78,
                            "CHECK failed: !parameter_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=(local_8d,pLVar2);
      }
      if ((local_79 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_78);
      }
      internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->parameter_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_compiler_version(this);
    if (bVar1) {
      local_c9 = 0;
      if (this->compiler_version_ == (Version *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                   ,0x336);
        local_c9 = 1;
        pLVar2 = internal::LogMessage::operator<<
                           (&local_c8,"CHECK failed: compiler_version_ != NULL: ");
        internal::LogFinisher::operator=(&local_ca,pLVar2);
      }
      if ((local_c9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_c8);
      }
      Version::Clear(this->compiler_version_);
    }
  }
  local_28 = &this->_has_bits_;
  memset(local_28,0,4);
  local_20 = &this->_internal_metadata_;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_18 = local_20;
    local_10 = local_20;
    internal::InternalMetadataWithArena::DoClear(local_20);
  }
  return;
}

Assistant:

void CodeGeneratorRequest::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorRequest)
  file_to_generate_.Clear();
  proto_file_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    if (has_parameter()) {
      GOOGLE_DCHECK(!parameter_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*parameter_.UnsafeRawStringPointer())->clear();
    }
    if (has_compiler_version()) {
      GOOGLE_DCHECK(compiler_version_ != NULL);
      compiler_version_->::google::protobuf::compiler::Version::Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}